

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_mcode.c
# Opt level: O1

void mcode_protfail(jit_State *J)

{
  code *pcVar1;
  lua_State *L;
  TValue *pTVar2;
  GCstr *pGVar3;
  
  pcVar1 = (code *)J[-1].penalty[0x39].pc.ptr64;
  if (pcVar1 != (code *)0x0) {
    L = J->L;
    pTVar2 = L->top;
    L->top = pTVar2 + 1;
    pGVar3 = lj_err_str(L,LJ_ERR_JITPROT);
    pTVar2->u64 = (ulong)pGVar3 | 0xfffd800000000000;
    (*pcVar1)(L);
  }
  exit(1);
}

Assistant:

void mcode_protfail(jit_State *J)
{
  lua_CFunction panic = J2G(J)->panic;
  if (panic) {
    lua_State *L = J->L;
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITPROT));
    panic(L);
  }
  exit(EXIT_FAILURE);
}